

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quant.h
# Opt level: O0

int IsFlat_C(int16_t *levels,int num_blocks,int thresh)

{
  int i;
  int score;
  int thresh_local;
  int num_blocks_local;
  int16_t *levels_local;
  
  score = 0;
  num_blocks_local = num_blocks;
  levels_local = levels;
  do {
    if (num_blocks_local < 1) {
      return 1;
    }
    for (i = 1; i < 0x10; i = i + 1) {
      score = (uint)(levels_local[i] != 0) + score;
      if (thresh < score) {
        return 0;
      }
    }
    levels_local = levels_local + 0x10;
    num_blocks_local = num_blocks_local + -1;
  } while( true );
}

Assistant:

static WEBP_INLINE int IsFlat(const int16_t* levels, int num_blocks,
                              int thresh) {
  int score = 0;
  while (num_blocks-- > 0) {      // TODO(skal): refine positional scoring?
    int i;
    for (i = 1; i < 16; ++i) {    // omit DC, we're only interested in AC
      score += (levels[i] != 0);
      if (score > thresh) return 0;
    }
    levels += 16;
  }
  return 1;
}